

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_get_tag(uchar **p,uchar *end,size_t *len,int tag)

{
  int tag_local;
  size_t *len_local;
  uchar *end_local;
  uchar **p_local;
  
  if ((long)end - (long)*p < 1) {
    p_local._4_4_ = -0x60;
  }
  else if ((uint)**p == tag) {
    *p = *p + 1;
    p_local._4_4_ = mbedtls_asn1_get_len(p,end,len);
  }
  else {
    p_local._4_4_ = -0x62;
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_get_tag( unsigned char **p,
                  const unsigned char *end,
                  size_t *len, int tag )
{
    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    if( **p != tag )
        return( MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    (*p)++;

    return( mbedtls_asn1_get_len( p, end, len ) );
}